

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsStrash.c
# Opt level: O0

void Abc_MfsConvertAigToHop_rec(Aig_Obj_t *pObj,Hop_Man_t *pHop)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p1;
  Hop_Obj_t *pHVar3;
  Hop_Man_t *pHop_local;
  Aig_Obj_t *pObj_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsStrash.c"
                  ,0x2e,"void Abc_MfsConvertAigToHop_rec(Aig_Obj_t *, Hop_Man_t *)");
  }
  if ((pObj->field_5).pData == (void *)0x0) {
    pAVar2 = Aig_ObjFanin0(pObj);
    Abc_MfsConvertAigToHop_rec(pAVar2,pHop);
    pAVar2 = Aig_ObjFanin1(pObj);
    Abc_MfsConvertAigToHop_rec(pAVar2,pHop);
    pAVar2 = Aig_ObjChild0Copy(pObj);
    p1 = Aig_ObjChild1Copy(pObj);
    pHVar3 = Hop_And(pHop,(Hop_Obj_t *)pAVar2,(Hop_Obj_t *)p1);
    (pObj->field_5).pData = pHVar3;
    iVar1 = Hop_IsComplement((Hop_Obj_t *)(pObj->field_5).pData);
    if (iVar1 != 0) {
      __assert_fail("!Hop_IsComplement((Hop_Obj_t *)pObj->pData)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsStrash.c"
                    ,0x34,"void Abc_MfsConvertAigToHop_rec(Aig_Obj_t *, Hop_Man_t *)");
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Recursively converts AIG from Aig_Man_t into Hop_Obj_t.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_MfsConvertAigToHop_rec( Aig_Obj_t * pObj, Hop_Man_t * pHop )
{
    assert( !Aig_IsComplement(pObj) );
    if ( pObj->pData )
        return;
    Abc_MfsConvertAigToHop_rec( Aig_ObjFanin0(pObj), pHop ); 
    Abc_MfsConvertAigToHop_rec( Aig_ObjFanin1(pObj), pHop );
    pObj->pData = Hop_And( pHop, (Hop_Obj_t *)Aig_ObjChild0Copy(pObj), (Hop_Obj_t *)Aig_ObjChild1Copy(pObj) ); 
    assert( !Hop_IsComplement((Hop_Obj_t *)pObj->pData) );
}